

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_1029e4::StatTestTwoStep::Run(StatTestTwoStep *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Test *pTVar3;
  bool bVar4;
  int iVar5;
  Node *pNVar6;
  string err;
  string local_70;
  string local_50;
  
  iVar5 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_StatTest).super_StateTestWithBuiltinRules.state_,
              "build out: cat mid\nbuild mid: cat in\n",(ManifestParserOptions)0x0);
  if (iVar5 != g_current_test->assertion_failures_) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    return;
  }
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"out","");
  pNVar6 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  pTVar3 = g_current_test;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar1;
  bVar4 = Node::Stat(pNVar6,&(this->super_StatTest).super_DiskInterface,&local_50);
  testing::Test::Check
            (pTVar3,bVar4,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
             ,0x120,"out->Stat(this, &err)");
  pTVar3 = g_current_test;
  iVar5 = std::__cxx11::string::compare((char *)&local_50);
  testing::Test::Check
            (pTVar3,iVar5 == 0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
             ,0x121,"\"\" == err");
  bVar4 = testing::Test::Check
                    (g_current_test,
                     (long)(this->super_StatTest).stats_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->super_StatTest).stats_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start == 0x20,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                     ,0x122,"1u == stats_.size()");
  if (bVar4) {
    DependencyScan::RecomputeDirty
              (&(this->super_StatTest).scan_,pNVar6,(vector<Node_*,_std::allocator<Node_*>_> *)0x0,
               (string *)0x0);
    bVar4 = testing::Test::Check
                      (g_current_test,
                       (long)(this->super_StatTest).stats_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->super_StatTest).stats_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start == 0x60,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                       ,0x124,"3u == stats_.size()");
    pTVar3 = g_current_test;
    if (bVar4) {
      iVar5 = std::__cxx11::string::compare
                        ((char *)(this->super_StatTest).stats_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
      bVar4 = testing::Test::Check
                        (pTVar3,iVar5 == 0,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                         ,0x125,"\"out\" == stats_[0]");
      pTVar3 = g_current_test;
      if (bVar4) {
        paVar2 = &local_70.field_2;
        local_70._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"out","");
        pNVar6 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_70);
        bVar4 = testing::Test::Check
                          (pTVar3,pNVar6->dirty_,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                           ,0x126,"GetNode(\"out\")->dirty()");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        pTVar3 = g_current_test;
        if (bVar4) {
          iVar5 = std::__cxx11::string::compare
                            ((char *)((this->super_StatTest).stats_.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
          bVar4 = testing::Test::Check
                            (pTVar3,iVar5 == 0,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                             ,0x127,"\"mid\" == stats_[1]");
          pTVar3 = g_current_test;
          if (bVar4) {
            local_70._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"mid","");
            pNVar6 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_70)
            ;
            bVar4 = testing::Test::Check
                              (pTVar3,pNVar6->dirty_,
                               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                               ,0x128,"GetNode(\"mid\")->dirty()");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != paVar2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            pTVar3 = g_current_test;
            if (bVar4) {
              iVar5 = std::__cxx11::string::compare
                                ((char *)((this->super_StatTest).stats_.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 2));
              bVar4 = testing::Test::Check
                                (pTVar3,iVar5 == 0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                                 ,0x129,"\"in\" == stats_[2]");
              if (bVar4) goto LAB_00167245;
            }
          }
        }
      }
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_00167245:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(StatTest, TwoStep) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build out: cat mid\n"
"build mid: cat in\n"));

  Node* out = GetNode("out");
  string err;
  EXPECT_TRUE(out->Stat(this, &err));
  EXPECT_EQ("", err);
  ASSERT_EQ(1u, stats_.size());
  scan_.RecomputeDirty(out, NULL, NULL);
  ASSERT_EQ(3u, stats_.size());
  ASSERT_EQ("out", stats_[0]);
  ASSERT_TRUE(GetNode("out")->dirty());
  ASSERT_EQ("mid",  stats_[1]);
  ASSERT_TRUE(GetNode("mid")->dirty());
  ASSERT_EQ("in",  stats_[2]);
}